

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O2

void VCProjectWriter::outputFilter(VCProject *project,XmlOutput *xml,QString *filtername)

{
  char cVar1;
  long *plVar2;
  VCFilter *pVVar3;
  XmlOutput *pXVar4;
  Node *oldD;
  long lVar5;
  int i;
  ulong uVar6;
  int x;
  ulong uVar7;
  long in_FS_OFFSET;
  triState local_5ec;
  xml_output local_5d8;
  xml_output local_5a0;
  xml_output local_568;
  xml_output local_530;
  QArrayDataPointer<char16_t> local_4f8;
  VCFilter filter;
  QArrayDataPointer<char16_t> local_98;
  QArrayDataPointer<char16_t> local_78;
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (((project->SingleProjects).d.ptr)->flat_files == true) {
    plVar2 = (long *)operator_new(0x10);
    *plVar2 = (long)&PTR__FlatNode_00268c70;
    plVar2[1] = 0;
  }
  else {
    plVar2 = (long *)operator_new(0x30);
    *plVar2 = (long)&PTR__TreeNode_00268c08;
    *(undefined1 *)(plVar2 + 1) = 0;
    plVar2[2] = 0;
    plVar2[3] = 0;
    plVar2[4] = 0;
    plVar2[5] = 0;
  }
  local_58.size = 0;
  local_78.size = 0;
  local_58.d = (Data *)0x0;
  local_58.ptr = (char16_t *)0x0;
  local_78.d = (Data *)0x0;
  local_78.ptr = (char16_t *)0x0;
  local_98.d = (Data *)0x0;
  local_98.ptr = (char16_t *)0x0;
  local_98.size = 0;
  local_5ec = unset;
  for (uVar6 = 0; uVar6 < (ulong)(project->SingleProjects).d.size; uVar6 = uVar6 + 1) {
    memset(&filter,0xaa,0x448);
    pVVar3 = VCProjectSingleConfig::filterByName((project->SingleProjects).d.ptr + uVar6,filtername)
    ;
    VCFilter::VCFilter(&filter,pVVar3);
    lVar5 = 0;
    for (uVar7 = 0; uVar7 < (ulong)filter.Files.d.size; uVar7 = uVar7 + 1) {
      (**(code **)(*plVar2 + 0x10))
                (plVar2,(long)&((filter.Files.d.ptr)->file).d.d + lVar5,
                 &(filter.Files.d.ptr)->excludeFromBuild + lVar5);
      lVar5 = lVar5 + 0x20;
    }
    if (local_58.size == 0) {
      QString::operator=((QString *)&local_58,(QString *)&filter);
      QString::operator=((QString *)&local_78,(QString *)&filter.Filter);
      local_5ec = filter.ParseFiles;
      QString::operator=((QString *)&local_98,(QString *)&filter.Guid);
    }
    VCFilter::~VCFilter(&filter);
  }
  cVar1 = (**(code **)(*plVar2 + 0x28))(plVar2);
  if (cVar1 != '\0') {
    if (local_58.size != 0) {
      QString::QString((QString *)&local_4f8,"Filter");
      tag((xml_output *)&filter,(QString *)&local_4f8);
      pXVar4 = XmlOutput::operator<<(xml,(xml_output *)&filter);
      attrS(&local_530,"Name",(QString *)&local_58);
      pXVar4 = XmlOutput::operator<<(pXVar4,&local_530);
      attrS(&local_568,"Filter",(QString *)&local_78);
      pXVar4 = XmlOutput::operator<<(pXVar4,&local_568);
      attrS(&local_5a0,"UniqueIdentifier",(QString *)&local_98);
      pXVar4 = XmlOutput::operator<<(pXVar4,&local_5a0);
      attrT(&local_5d8,"ParseFiles",local_5ec);
      XmlOutput::operator<<(pXVar4,&local_5d8);
      XmlOutput::xml_output::~xml_output(&local_5d8);
      XmlOutput::xml_output::~xml_output(&local_5a0);
      XmlOutput::xml_output::~xml_output(&local_568);
      XmlOutput::xml_output::~xml_output(&local_530);
      XmlOutput::xml_output::~xml_output((xml_output *)&filter);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_4f8);
    }
    QString::QString(&filter.Name,"");
    (**(code **)(*plVar2 + 0x20))(plVar2,xml,&filter,project,filtername);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&filter);
    if (local_58.size != 0) {
      QString::QString((QString *)&local_530,"Filter");
      closetag((xml_output *)&filter,(QString *)&local_530);
      XmlOutput::operator<<(xml,(xml_output *)&filter);
      XmlOutput::xml_output::~xml_output((xml_output *)&filter);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_530);
    }
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
  (**(code **)(*plVar2 + 8))(plVar2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VCProjectWriter::outputFilter(VCProject &project, XmlOutput &xml, const QString &filtername)
{
    QScopedPointer<Node> root;
    if (project.SingleProjects.at(0).flat_files)
        root.reset(new FlatNode);
    else
        root.reset(new TreeNode);

    QString name, extfilter, guid;
    triState parse = unset;

    for (int i = 0; i < project.SingleProjects.size(); ++i) {
        const VCFilter filter = project.SingleProjects.at(i).filterByName(filtername);

        // Merge all files in this filter to root tree
        for (int x = 0; x < filter.Files.size(); ++x)
            root->addElement(filter.Files.at(x));

        // Save filter setting from first filter. Next filters
        // may differ but we cannot handle that. (ex. extfilter)
        if (name.isEmpty()) {
            name = filter.Name;
            extfilter = filter.Filter;
            parse = filter.ParseFiles;
            guid = filter.Guid;
        }
    }

    if (!root->hasElements())
        return;

    // Actual XML output ----------------------------------
    if (!name.isEmpty()) {
        xml << tag(_Filter)
                << attrS(_Name, name)
                << attrS(_Filter, extfilter)
                << attrS(_UniqueIdentifier, guid)
                << attrT(_ParseFiles, parse);
    }
    root->generateXML(xml, "", project, filtername); // output root tree
    if (!name.isEmpty())
        xml << closetag(_Filter);
}